

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

void restart_read_request(cio_http_client *client)

{
  cio_error cVar1;
  cio_http_server *pcVar2;
  cio_error err;
  cio_http_server *server;
  cio_http_client *client_local;
  
  if ((((client->http_private).request_complete & 1U) != 0) &&
     (((client->http_private).response_written_completed & 1U) != 0)) {
    free_handler(client);
    pcVar2 = cio_http_client_get_server(client);
    cVar1 = cio_timer_expires_from_now
                      (&(client->http_private).request_timer,pcVar2->read_header_timeout_ns,
                       client_timeout_handler,client);
    if (cVar1 == CIO_SUCCESS) {
      cio_write_buffer_head_init(&client->response_wbh);
      http_parser_settings_init(&client->parser_settings);
      (client->parser_settings).on_url = on_url;
      http_parser_init(&client->parser,HTTP_REQUEST);
      (client->http_private).response_fired = false;
      (client->http_private).request_complete = false;
      (client->http_private).response_written = false;
      (client->http_private).response_written_completed = false;
      (client->http_private).finish_func = finish_request_line;
      cVar1 = cio_buffered_stream_read_until
                        (&client->buffered_stream,&client->rb,"\r\n",parse,client);
      if (cVar1 != CIO_SUCCESS) {
        handle_server_error(client,"Could not restart read request");
      }
    }
    else {
      handle_server_error(client,"Could not re-arm timer for restarting a read request");
    }
  }
  return;
}

Assistant:

static void restart_read_request(struct cio_http_client *client)
{
	if ((client->http_private.request_complete) && (client->http_private.response_written_completed)) {
		free_handler(client);
		const struct cio_http_server *server = cio_http_client_get_server(client);
		enum cio_error err = cio_timer_expires_from_now(&client->http_private.request_timer, server->read_header_timeout_ns, client_timeout_handler, client);
		if (cio_unlikely(err != CIO_SUCCESS)) {
			handle_server_error(client, "Could not re-arm timer for restarting a read request");
			return;
		}

		cio_write_buffer_head_init(&client->response_wbh);
		http_parser_settings_init(&client->parser_settings);
		client->parser_settings.on_url = on_url;
		http_parser_init(&client->parser, HTTP_REQUEST);

		client->http_private.response_fired = false;
		client->http_private.request_complete = false;
		client->http_private.response_written = false;
		client->http_private.response_written_completed = false;

		client->http_private.finish_func = finish_request_line;
		err = cio_buffered_stream_read_until(&client->buffered_stream, &client->rb, CIO_CRLF, parse, client);
		if (cio_unlikely(err != CIO_SUCCESS)) {
			handle_server_error(client, "Could not restart read request");
		}
	}
}